

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_coarsen_topology.cpp
# Opt level: O2

void Omega_h::mark_dead_ents
               (Mesh *mesh,LOs *rails2edges,Read<signed_char> *rail_col_dirs,Int cell_dim,
               Write<signed_char> *dead_cells,Write<signed_char> *dead_sides)

{
  int iVar1;
  Alloc *pAVar2;
  int iVar3;
  ulong uVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  LOs cs2s;
  Read<signed_char> ec_codes;
  LOs ec2c;
  LOs e2ec;
  Adj local_210;
  Write<int> local_1e0;
  Write<signed_char> local_1d0;
  int local_1c0;
  Write<int> local_1b8;
  int local_1a8;
  Write<signed_char> local_1a0;
  Write<signed_char> local_190;
  type f;
  Write<int> local_f0;
  Write<signed_char> local_e0;
  Write<int> local_d0;
  Write<int> local_c0;
  Write<signed_char> local_b0;
  int local_a0;
  Write<int> local_98;
  int local_88;
  Write<signed_char> local_80;
  Write<signed_char> local_70;
  Adj e2c;
  
  Mesh::ask_up(&e2c,mesh,1,cell_dim);
  Write<int>::Write(&e2ec.write_,(Write<int> *)&e2c);
  Write<int>::Write(&ec2c.write_,&e2c.super_Graph.ab2b.write_);
  Write<signed_char>::Write(&ec_codes.write_,&e2c.codes.write_);
  Mesh::ask_down(&local_210,mesh,cell_dim,cell_dim + -1);
  Write<int>::Write(&cs2s.write_,&local_210.super_Graph.ab2b.write_);
  Adj::~Adj(&local_210);
  f.nccs = cell_dim + 1;
  if (3 < (uint)cell_dim) {
    f.nccs = -1;
  }
  pAVar2 = (rails2edges->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    uVar4 = pAVar2->size;
  }
  else {
    uVar4 = (ulong)pAVar2 >> 3;
  }
  Write<int>::Write((Write<int> *)&f,&rails2edges->write_);
  Write<signed_char>::Write(&f.rail_col_dirs.write_,&rail_col_dirs->write_);
  Write<int>::Write(&f.e2ec.write_,&e2ec.write_);
  Write<int>::Write(&f.ec2c.write_,&ec2c.write_);
  Write<signed_char>::Write(&f.ec_codes.write_,&ec_codes.write_);
  f.cell_dim = cell_dim;
  Write<int>::Write(&f.cs2s.write_,&cs2s.write_);
  Write<signed_char>::Write(&f.dead_cells,dead_cells);
  Write<signed_char>::Write(&f.dead_sides,dead_sides);
  Write<int>::Write(&local_f0,(Write<int> *)&f);
  Write<signed_char>::Write(&local_e0,&f.rail_col_dirs.write_);
  Write<int>::Write(&local_d0,&f.e2ec.write_);
  Write<int>::Write(&local_c0,&f.ec2c.write_);
  Write<signed_char>::Write(&local_b0,&f.ec_codes.write_);
  local_a0 = f.cell_dim;
  Write<int>::Write(&local_98,&f.cs2s.write_);
  local_88 = f.nccs;
  Write<signed_char>::Write(&local_80,&f.dead_cells);
  Write<signed_char>::Write(&local_70,&f.dead_sides);
  uVar6 = (uint)(uVar4 >> 2);
  if (0 < (int)uVar6) {
    entering_parallel = 1;
    Write<int>::Write((Write<int> *)&local_210,&local_f0);
    Write<signed_char>::Write((Write<signed_char> *)&local_210.super_Graph.ab2b,&local_e0);
    Write<int>::Write((Write<int> *)&local_210.codes,&local_d0);
    Write<int>::Write(&local_1e0,&local_c0);
    Write<signed_char>::Write(&local_1d0,&local_b0);
    local_1c0 = local_a0;
    Write<int>::Write(&local_1b8,&local_98);
    local_1a8 = local_88;
    Write<signed_char>::Write(&local_1a0,&local_80);
    Write<signed_char>::Write(&local_190,&local_70);
    entering_parallel = 0;
    for (uVar4 = 0; uVar4 != (uVar6 & 0x7fffffff); uVar4 = uVar4 + 1) {
      lVar8 = (long)*(int *)((long)local_210.super_Graph.a2ab.write_.shared_alloc_.direct_ptr +
                            uVar4 * 4);
      uVar9 = 1 - (int)*(char *)((long)local_210.super_Graph.ab2b.write_.shared_alloc_.direct_ptr +
                                uVar4);
      for (lVar10 = (long)*(int *)((long)local_210.codes.write_.shared_alloc_.direct_ptr + lVar8 * 4
                                  );
          lVar10 < *(int *)((long)local_210.codes.write_.shared_alloc_.direct_ptr + lVar8 * 4 + 4);
          lVar10 = lVar10 + 1) {
        iVar1 = *(int *)((long)local_1e0.shared_alloc_.direct_ptr + lVar10 * 4);
        if (local_1c0 == 1) {
          iVar11 = 2;
          goto LAB_0025a83c;
        }
        cVar5 = (char)*(byte *)((long)local_1d0.shared_alloc_.direct_ptr + lVar10) >> 3;
        uVar7 = *(byte *)((long)local_1d0.shared_alloc_.direct_ptr + lVar10) >> 1 & 3;
        uVar12 = uVar9 ^ uVar7;
        if (local_1c0 == 2) {
          if (cVar5 == '\x02') {
            iVar11 = 0;
            if (uVar9 != uVar7) {
              iVar11 = 1;
LAB_0025a818:
              if (uVar12 != 1) goto switchD_0025a780_default;
            }
          }
          else {
            if (cVar5 == '\x01') goto switchD_0025a780_caseD_3;
            if (cVar5 == '\0') {
              iVar11 = (uint)(uVar12 == 1) * 3 + -1;
              goto LAB_0025a832;
            }
switchD_0025a780_default:
            iVar11 = -1;
          }
          goto LAB_0025a83c;
        }
        iVar11 = -1;
        if (local_1c0 != 3) goto LAB_0025a83c;
        switch(cVar5) {
        case '\0':
          iVar11 = (uint)(uVar12 == 1) * 4 + -1;
          break;
        case '\x01':
          iVar11 = (uint)(uVar12 == 1) * 2 + -1;
          goto LAB_0025a805;
        case '\x02':
          iVar11 = 1;
          if (uVar9 != uVar7) {
            iVar11 = 2;
            goto LAB_0025a818;
          }
          goto LAB_0025a83c;
        case '\x03':
switchD_0025a780_caseD_3:
          iVar11 = -(uint)(uVar12 != 1);
          break;
        case '\x04':
          iVar11 = -(uint)(uVar12 != 1);
LAB_0025a805:
          iVar3 = 3;
LAB_0025a837:
          if (uVar9 == uVar7) {
            iVar11 = iVar3;
          }
          goto LAB_0025a83c;
        case '\x05':
          iVar11 = -(uint)(uVar12 != 1);
LAB_0025a832:
          iVar3 = 1;
          goto LAB_0025a837;
        default:
          goto switchD_0025a780_default;
        }
        if (uVar9 == uVar7) {
          iVar11 = 2;
        }
LAB_0025a83c:
        iVar11 = *(int *)((long)local_1b8.shared_alloc_.direct_ptr +
                         (long)(local_1a8 * iVar1 + iVar11) * 4);
        *(undefined1 *)((long)local_1a0.shared_alloc_.direct_ptr + (long)iVar1) = 1;
        *(undefined1 *)((long)local_190.shared_alloc_.direct_ptr + (long)iVar11) = 1;
      }
    }
    mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
    ::$_0::~__0((__0 *)&local_210);
  }
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&local_f0);
  mark_dead_ents(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<signed_char>,int,Omega_h::Write<signed_char>&,Omega_h::Write<signed_char>&)
  ::$_0::~__0((__0 *)&f);
  Write<int>::~Write(&cs2s.write_);
  Write<signed_char>::~Write(&ec_codes.write_);
  Write<int>::~Write(&ec2c.write_);
  Write<int>::~Write(&e2ec.write_);
  Adj::~Adj(&e2c);
  return;
}

Assistant:

void mark_dead_ents(Mesh* mesh, LOs rails2edges, Read<I8> rail_col_dirs,
    Int cell_dim, Write<I8>& dead_cells, Write<I8>& dead_sides) {
  auto e2c = mesh->ask_up(EDGE, cell_dim);
  auto e2ec = e2c.a2ab;
  auto ec2c = e2c.ab2b;
  auto ec_codes = e2c.codes;
  auto cs2s = mesh->ask_down(cell_dim, cell_dim - 1).ab2b;
  auto nccs = simplex_degree(cell_dim, cell_dim - 1);
  auto nrails = rails2edges.size();
  auto f = OMEGA_H_LAMBDA(LO rail) {
    auto e = rails2edges[rail];
    auto eev_col = rail_col_dirs[rail];
    auto eev_onto = 1 - eev_col;
    for (auto ec = e2ec[e]; ec < e2ec[e + 1]; ++ec) {
      auto c = ec2c[ec];
      auto ec_code = ec_codes[ec];
      auto cce = code_which_down(ec_code);
      auto rot = code_rotation(ec_code);
      auto cev_onto = rot ^ eev_onto;
      auto ccv_onto = simplex_down_template(cell_dim, EDGE, cce, cev_onto);
      auto ccs_opp = simplex_opposite_template(cell_dim, VERT, ccv_onto);
      auto s_opp = cs2s[c * nccs + ccs_opp];
      dead_cells[c] = 1;
      dead_sides[s_opp] = 1;
    }
  };
  parallel_for(nrails, f, "mark_dead_ents");
}